

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O2

string * __thiscall
MetaCommand::GetValueAsString
          (string *__return_storage_ptr__,MetaCommand *this,string *optionName,string *fieldName)

{
  __type _Var1;
  pointer __lhs;
  pointer __lhs_00;
  string fieldname;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)fieldName);
  if (fieldName->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&local_50);
  }
  __lhs_00 = (this->m_OptionVector).
             super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
             super__Vector_impl_data._M_start;
  do {
    if (__lhs_00 ==
        (this->m_OptionVector).
        super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_51);
LAB_001168b9:
      std::__cxx11::string::~string((string *)&local_50);
      return __return_storage_ptr__;
    }
    _Var1 = std::operator==(&__lhs_00->name,optionName);
    if (_Var1) {
      for (__lhs = (__lhs_00->fields).
                   super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          __lhs != (__lhs_00->fields).
                   super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                   _M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
        _Var1 = std::operator==(&__lhs->name,&local_50);
        if (_Var1) {
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&__lhs->value);
          goto LAB_001168b9;
        }
      }
    }
    __lhs_00 = __lhs_00 + 1;
  } while( true );
}

Assistant:

METAIO_STL::string MetaCommand::GetValueAsString(METAIO_STL::string optionName,
                                          METAIO_STL::string fieldName)
{
  METAIO_STL::string fieldname = fieldName;
  if (fieldName.empty()) {
    fieldname = optionName;
  }

  OptionVector::const_iterator it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    if((*it).name == optionName)
      {
      auto itField = (*it).fields.begin();
      while(itField != (*it).fields.end())
        {
        if((*itField).name == fieldname)
          {
          return (*itField).value;
          }
        ++itField;
        }
      }
    ++it;
    }
  return "";
}